

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

void __thiscall ncnn::Option::Option(Option *this)

{
  int iVar1;
  undefined1 *in_RDI;
  
  *in_RDI = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  iVar1 = get_physical_big_cpu_count();
  *(int *)(in_RDI + 4) = iVar1;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0x14;
  in_RDI[0x1c] = 1;
  in_RDI[0x1d] = 1;
  in_RDI[0x1e] = 1;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 1;
  in_RDI[0x22] = 1;
  in_RDI[0x23] = 1;
  in_RDI[0x24] = 1;
  in_RDI[0x25] = 1;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 1;
  *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  *(undefined4 *)(in_RDI + 0x30) = 3;
  in_RDI[0x34] = 1;
  in_RDI[0x35] = 1;
  in_RDI[0x36] = 1;
  in_RDI[0x37] = 1;
  in_RDI[0x38] = 1;
  in_RDI[0x39] = 1;
  iVar1 = is_current_thread_running_on_a53_a55();
  in_RDI[0x3a] = iVar1 != 0;
  in_RDI[0x3b] = 1;
  in_RDI[0x3c] = 1;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x3f] = 0;
  return;
}

Assistant:

Option::Option()
{
    lightmode = true;
    use_shader_pack8 = false;
    use_subgroup_ops = false;
    use_reserved_0 = false;

    num_threads = get_physical_big_cpu_count();
    blob_allocator = 0;
    workspace_allocator = 0;

#if NCNN_VULKAN
    blob_vkallocator = 0;
    workspace_vkallocator = 0;
    staging_vkallocator = 0;
    pipeline_cache = 0;
#endif // NCNN_VULKAN

    openmp_blocktime = 20;

    use_winograd_convolution = true;
    use_sgemm_convolution = true;
    use_int8_inference = true;
    use_vulkan_compute = false; // TODO enable me

    use_bf16_storage = false;

    use_fp16_packed = true;
    use_fp16_storage = true;
    use_fp16_arithmetic = true;
    use_int8_packed = true;
    use_int8_storage = true;
    use_int8_arithmetic = false;

    use_packing_layout = true;

    vulkan_device_index = -1;
    use_reserved_1 = false;

    use_image_storage = false;
    use_tensor_storage = false;

    use_reserved_2 = false;

    flush_denormals = 3;

    use_local_pool_allocator = true;

    use_shader_local_memory = true;
    use_cooperative_matrix = true;

    use_winograd23_convolution = true;
    use_winograd43_convolution = true;
    use_winograd63_convolution = true;

    use_a53_a55_optimized_kernel = is_current_thread_running_on_a53_a55();

    use_fp16_uniform = true;
    use_int8_uniform = true;

    use_reserved_9 = false;
    use_reserved_10 = false;
    use_reserved_11 = false;
}